

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

Result<unsigned_int> * __thiscall
vkb::Device::get_queue_index
          (Result<unsigned_int> *__return_storage_ptr__,Device *this,QueueType type)

{
  bool bVar1;
  uint32_t uVar2;
  
  switch(type) {
  case present:
    uVar2 = detail::get_present_queue_index
                      ((this->physical_device).physical_device,this->surface,&this->queue_families);
    if (uVar2 != 0xffffffff) {
LAB_0011fd31:
      (__return_storage_ptr__->field_0).m_value = uVar2;
      bVar1 = true;
      goto LAB_0011fd56;
    }
    (__return_storage_ptr__->field_0).m_value = 0;
    break;
  case graphics:
    uVar2 = detail::get_first_queue_index(&this->queue_families,1);
    if (uVar2 != 0xffffffff) goto LAB_0011fd31;
    (__return_storage_ptr__->field_0).m_value = 1;
    break;
  case compute:
    uVar2 = detail::get_separate_queue_index(&this->queue_families,2,4);
    if (uVar2 != 0xffffffff) goto LAB_0011fd31;
    (__return_storage_ptr__->field_0).m_value = 2;
    break;
  case transfer:
    uVar2 = detail::get_separate_queue_index(&this->queue_families,4,2);
    if (uVar2 != 0xffffffff) goto LAB_0011fd31;
    (__return_storage_ptr__->field_0).m_value = 3;
    break;
  default:
    (__return_storage_ptr__->field_0).m_value = 5;
  }
  *(undefined8 **)((long)&__return_storage_ptr__->field_0 + 8) = &detail::queue_error_category;
  (__return_storage_ptr__->field_0).m_error.vk_result = VK_SUCCESS;
  bVar1 = false;
LAB_0011fd56:
  __return_storage_ptr__->m_init = bVar1;
  return __return_storage_ptr__;
}

Assistant:

Result<uint32_t> Device::get_queue_index(QueueType type) const {
    uint32_t index = detail::QUEUE_INDEX_MAX_VALUE;
    switch (type) {
        case QueueType::present:
            index = detail::get_present_queue_index(physical_device.physical_device, surface, queue_families);
            if (index == detail::QUEUE_INDEX_MAX_VALUE) return Result<uint32_t>{ QueueError::present_unavailable };
            break;
        case QueueType::graphics:
            index = detail::get_first_queue_index(queue_families, VK_QUEUE_GRAPHICS_BIT);
            if (index == detail::QUEUE_INDEX_MAX_VALUE) return Result<uint32_t>{ QueueError::graphics_unavailable };
            break;
        case QueueType::compute:
            index = detail::get_separate_queue_index(queue_families, VK_QUEUE_COMPUTE_BIT, VK_QUEUE_TRANSFER_BIT);
            if (index == detail::QUEUE_INDEX_MAX_VALUE) return Result<uint32_t>{ QueueError::compute_unavailable };
            break;
        case QueueType::transfer:
            index = detail::get_separate_queue_index(queue_families, VK_QUEUE_TRANSFER_BIT, VK_QUEUE_COMPUTE_BIT);
            if (index == detail::QUEUE_INDEX_MAX_VALUE) return Result<uint32_t>{ QueueError::transfer_unavailable };
            break;
        default:
            return Result<uint32_t>{ QueueError::invalid_queue_family_index };
    }
    return index;
}